

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::
unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
::
unordered_flat_map<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>const*>
          (unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
           *this,pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::KnownSystemName>
                 *first,
          pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::KnownSystemName>
          *last,size_type n,hasher *h,key_equal *pred,allocator_type *a)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  size_t __n;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  ulong uVar10;
  uint64_t hash;
  uint uVar11;
  ulong uVar12;
  ulong pos0;
  long lVar13;
  size_t *psVar14;
  ulong uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  value_type *elements;
  locator res;
  locator local_48;
  
  detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::KnownSystemName>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::KnownSystemName>_>_>
  ::new_(this,&local_48,n);
  uVar10 = *(long *)(this + 8) * 0xf + 0xe;
  if (*(long *)(this + 0x18) == 0) {
    uVar10 = 0;
  }
  uVar12 = (ulong)((float)uVar10 * 0.875);
  uVar12 = (long)((float)uVar10 * 0.875 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12;
  if (uVar10 < 0x1e) {
    uVar12 = uVar10;
  }
  *(ulong *)(this + 0x20) = uVar12;
  *(undefined8 *)(this + 0x28) = 0;
  if (first != last) {
    do {
      hash = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this,
                        &first->first);
      pos0 = hash >> ((byte)*this & 0x3f);
      lVar3 = *(long *)(this + 0x10);
      lVar1 = (hash & 0xff) * 4;
      cVar5 = detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
              match_word(unsigned_long)::word[lVar1 + 0xc];
      cVar6 = detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
              match_word(unsigned_long)::word[lVar1 + 0xd];
      cVar7 = detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
              match_word(unsigned_long)::word[lVar1 + 0xe];
      cVar8 = detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
              match_word(unsigned_long)::word[lVar1 + 0xf];
      lVar1 = *(long *)(this + 0x18);
      uVar10 = *(ulong *)(this + 8);
      uVar15 = 0;
      uVar12 = pos0;
      do {
        pcVar2 = (char *)(lVar3 + uVar12 * 0x10);
        auVar17[0] = -(*pcVar2 == cVar5);
        auVar17[1] = -(pcVar2[1] == cVar6);
        auVar17[2] = -(pcVar2[2] == cVar7);
        auVar17[3] = -(pcVar2[3] == cVar8);
        auVar17[4] = -(pcVar2[4] == cVar5);
        auVar17[5] = -(pcVar2[5] == cVar6);
        auVar17[6] = -(pcVar2[6] == cVar7);
        auVar17[7] = -(pcVar2[7] == cVar8);
        auVar17[8] = -(pcVar2[8] == cVar5);
        auVar17[9] = -(pcVar2[9] == cVar6);
        auVar17[10] = -(pcVar2[10] == cVar7);
        auVar17[0xb] = -(pcVar2[0xb] == cVar8);
        auVar17[0xc] = -(pcVar2[0xc] == cVar5);
        auVar17[0xd] = -(pcVar2[0xd] == cVar6);
        auVar17[0xe] = -(pcVar2[0xe] == cVar7);
        auVar17[0xf] = -(pcVar2[0xf] == cVar8);
        uVar11 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
        if (uVar11 != 0) {
          __n = (first->first)._M_len;
          pcVar2 = (first->first)._M_str;
          do {
            uVar4 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
            psVar14 = (size_t *)(lVar1 + uVar12 * 0x168 + (ulong)uVar4 * 0x18);
            bVar16 = __n == *psVar14;
            if (bVar16 && __n != 0) {
              iVar9 = bcmp(pcVar2,(void *)psVar14[1],__n);
              bVar16 = iVar9 == 0;
            }
            if (bVar16) goto LAB_0023afbe;
            uVar11 = uVar11 - 1 & uVar11;
          } while (uVar11 != 0);
        }
        if ((*(byte *)(uVar12 * 0x10 + lVar3 + 0xf) &
            *(byte *)((long)&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
                             is_not_overflowed(unsigned_long)::shift + (ulong)((uint)hash & 7))) ==
            0) break;
        lVar13 = uVar12 + uVar15;
        uVar15 = uVar15 + 1;
        uVar12 = lVar13 + 1U & uVar10;
      } while (uVar15 <= uVar10);
      psVar14 = (size_t *)0x0;
LAB_0023afbe:
      if (psVar14 == (size_t *)0x0) {
        if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x20)) {
          detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
          ::
          nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>const&>
                    (&local_48,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
                      *)this,(arrays_type *)this,pos0,hash,first);
          *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
        }
        else {
          detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
          ::
          unchecked_emplace_with_rehash<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>const&>
                    (&local_48,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::KnownSystemName>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::KnownSystemName>>>
                      *)this,hash,first);
        }
      }
      first = first + 1;
    } while (first != last);
  }
  return;
}

Assistant:

unordered_flat_map(Iterator first, Iterator last, size_type n = 0, hasher const& h = hasher(),
                       key_equal const& pred = key_equal(),
                       allocator_type const& a = allocator_type()) :
        unordered_flat_map(n, h, pred, a) {
        this->insert(first, last);
    }